

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O1

int ext_loader_impl_execution_path(loader_impl impl,char *path)

{
  _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  *this;
  char *local_48;
  path local_40;
  
  local_48 = path;
  this = (_Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          *)loader_impl_get();
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_40,&local_48,auto_format);
  std::
  _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
  ::_M_insert_unique<std::filesystem::__cxx11::path>(this,&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  return 0;
}

Assistant:

int ext_loader_impl_execution_path(loader_impl impl, const loader_path path)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	ext_impl->paths.insert(fs::path(path));

	return 0;
}